

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

IVal * deqp::gls::BuiltinPrecisionTests::
       ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
                 (IVal *__return_storage_ptr__,FloatFormat *fmt,IVal *value)

{
  bool *pbVar1;
  long lVar2;
  Interval local_40;
  
  lVar2 = 0x10;
  do {
    *(undefined1 *)((long)__return_storage_ptr__->m_data + lVar2 + -0x10) = 0;
    *(undefined8 *)((long)__return_storage_ptr__->m_data + lVar2 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(&__return_storage_ptr__->m_data[0].m_hasNaN + lVar2) = 0xfff0000000000000;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x40);
  lVar2 = 0;
  do {
    (&__return_storage_ptr__->m_data[0].m_hasNaN)[lVar2] = false;
    *(undefined8 *)((long)&__return_storage_ptr__->m_data[0].m_lo + lVar2) = 0x7ff0000000000000;
    *(undefined8 *)((long)&__return_storage_ptr__->m_data[0].m_hi + lVar2) = 0xfff0000000000000;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 == 0x18);
  lVar2 = 0;
  do {
    tcu::FloatFormat::convert(&local_40,fmt,(Interval *)(&value->m_data[0].m_hasNaN + lVar2));
    *(double *)((long)&__return_storage_ptr__->m_data[0].m_hi + lVar2) = local_40.m_hi;
    pbVar1 = &__return_storage_ptr__->m_data[0].m_hasNaN + lVar2;
    *(undefined8 *)pbVar1 = local_40._0_8_;
    *(double *)(pbVar1 + 8) = local_40.m_lo;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 == 0x18);
  return __return_storage_ptr__;
}

Assistant:

static IVal			doConvert		(const FloatFormat& fmt, const IVal& value)
	{
		IVal ret;

		for (int ndx = 0; ndx < T::SIZE; ++ndx)
			ret[ndx] = convert<Element>(fmt, value[ndx]);

		return ret;
	}